

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::DeferredFailIfNotUnicode
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,HRESULT error)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseError *this_00;
  EncodedChar *pEVar5;
  EncodedChar *pEVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x249,"(this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                       "this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
    if (!bVar2) goto LAB_00ea59aa;
    *puVar4 = 0;
  }
  if (this->deferredIfNotUnicodeError == (ParseError *)0x0) {
    this_00 = (ParseError *)new<Memory::ArenaAllocator>(0x10,this->ctAllocator,0x364470);
    bVar2 = this->inBody;
    pEVar5 = this->input;
    pEVar6 = this->next;
    uVar7 = (long)pEVar6 - (long)pEVar5;
    uVar8 = uVar7;
    if (pEVar6 < pEVar5 || 0xfffffffd < (long)uVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x9c,"(ph >= pl && ph - pl <= MaxCharCount)",
                         "ph >= pl && ph - pl <= MaxCharCount");
      if (!bVar3) goto LAB_00ea59aa;
      *puVar4 = 0;
      pEVar5 = this->input;
      pEVar6 = this->next;
      uVar8 = (long)pEVar6 - (long)pEVar5;
    }
    if (pEVar6 < pEVar5 || 0xfffffffd < (long)uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x9c,"(ph >= pl && ph - pl <= MaxCharCount)",
                         "ph >= pl && ph - pl <= MaxCharCount");
      if (!bVar3) {
LAB_00ea59aa:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    ParseError::ParseError(this_00,bVar2,(CharCount)(uVar7 >> 1),(CharCount)(uVar8 >> 1),error);
    this->deferredIfNotUnicodeError = this_00;
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::DeferredFailIfNotUnicode(HRESULT error)
    {
        Assert(this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());
        if (this->deferredIfNotUnicodeError == nullptr)
        {
            this->deferredIfNotUnicodeError = Anew(ctAllocator, ParseError, inBody, Pos(), Chars<EncodedChar>::OSB(next, input), error);
        }
    }